

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O2

string * __thiscall
jbcoin::STInteger<unsigned_short>::getText_abi_cxx11_
          (string *__return_storage_ptr__,STInteger<unsigned_short> *this)

{
  int iVar1;
  Item *pIVar2;
  unsigned_short in_DX;
  unsigned_short extraout_DX;
  unsigned_short extraout_DX_00;
  
  iVar1 = ((this->super_STBase).fName)->fieldCode;
  if (iVar1 == sfLedgerEntryType) {
    LedgerFormats::getInstance();
    pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::findByType
                       (&LedgerFormats::getInstance::instance.
                         super_KnownFormats<jbcoin::LedgerEntryType>,(uint)this->value_);
    if (pIVar2 == (Item *)0x0) {
      iVar1 = ((this->super_STBase).fName)->fieldCode;
      in_DX = extraout_DX;
      goto LAB_001d99e3;
    }
LAB_001d9a06:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pIVar2->m_name);
  }
  else {
LAB_001d99e3:
    if (iVar1 == sfTransactionType) {
      TxFormats::getInstance();
      pIVar2 = (Item *)KnownFormats<jbcoin::TxType>::findByType
                                 (&TxFormats::getInstance::instance.
                                   super_KnownFormats<jbcoin::TxType>,(uint)this->value_);
      in_DX = extraout_DX_00;
      if (pIVar2 != (Item *)0x0) goto LAB_001d9a06;
    }
    beast::lexicalCastThrow<std::__cxx11::string,unsigned_short>
              (__return_storage_ptr__,(beast *)(ulong)this->value_,in_DX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
STUInt16::getText () const
{
    if (getFName () == sfLedgerEntryType)
    {
        auto item = LedgerFormats::getInstance ().findByType (
            static_cast <LedgerEntryType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    if (getFName () == sfTransactionType)
    {
        auto item =TxFormats::getInstance().findByType (
            static_cast <TxType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    return beast::lexicalCastThrow <std::string> (value_);
}